

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipstats.cpp
# Opt level: O0

uint32_t __thiscall IPStatsRecord::Hash(IPStatsRecord *this)

{
  ulong local_28;
  size_t i;
  uint32_t h;
  uint32_t fnv_offset_32;
  uint32_t fnv_prime_32;
  IPStatsRecord *this_local;
  
  i._4_4_ = 0x811c9dc5;
  for (local_28 = 0; local_28 < this->ipaddr_length; local_28 = local_28 + 1) {
    i._4_4_ = (uint)this->ip_addr[local_28] ^ i._4_4_ * 0x1000193;
  }
  return i._4_4_;
}

Assistant:

uint32_t IPStatsRecord::Hash()
{
    const uint32_t fnv_prime_32 = 0x01000193;
    const uint32_t fnv_offset_32 = 0x811c9dc5;
    uint32_t h = fnv_offset_32;
    for (size_t i = 0; i < ipaddr_length; i++) {
        h = h * fnv_prime_32;
        h ^= ip_addr[i];
    }
    return h;
}